

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall ConfigTest_get_format_Test::TestBody(ConfigTest_get_format_Test *this)

{
  pointer pcVar1;
  char *pcVar2;
  internal local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [32];
  path local_60;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [13])"example.json",auto_format);
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  jessilib::config::get_format((path *)local_80,(string *)&local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_90,"config::get_format(\"example.json\")","\"json\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (char (*) [5])0x46b434);
  pcVar1 = local_80 + 0x10;
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_60);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((long *)local_60._M_pathname._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_pathname._M_dataplus._M_p + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [13])"example.json",auto_format);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"xml","");
  jessilib::config::get_format((path *)local_80,(string *)&local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_90,"config::get_format(\"example.json\", \"xml\")","\"xml\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (char (*) [4])"xml");
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_60);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((long *)local_60._M_pathname._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_pathname._M_dataplus._M_p + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_60,(char (*) [8])"example",auto_format);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"json","");
  jessilib::config::get_format((path *)local_80,(string *)&local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_90,"config::get_format(\"example\", \"json\")","\"json\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (char (*) [5])0x46b434);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_60);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if ((long *)local_60._M_pathname._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_pathname._M_dataplus._M_p + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  return;
}

Assistant:

TEST(ConfigTest, get_format) {
	EXPECT_EQ(config::get_format("example.json"), "json");
	EXPECT_EQ(config::get_format("example.json", "xml"), "xml");
	EXPECT_EQ(config::get_format("example", "json"), "json");
}